

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_label_name_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::CheckLabelNameTest_reject_le_for_histogram_Test::TestBody
          (CheckLabelNameTest_reject_le_for_histogram_Test *this)

{
  ParamType *pPVar1;
  string *name;
  char *message;
  allocator local_42;
  bool local_41;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  CheckLabelNameTest local_28;
  
  pPVar1 = testing::WithParamInterface<prometheus::MetricType>::GetParam();
  local_40.data_._0_1_ = *pPVar1 != Histogram;
  name = (string *)0x16b9eb;
  std::__cxx11::string::string((string *)&local_28,"le",&local_42);
  local_41 = CheckLabelNameTest::CheckLabelName(&local_28,name);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"GetParam() != MetricType::Histogram","CheckLabelName(\"le\")",
             (bool *)&local_40,&local_41);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/check_label_name_test.cc"
               ,0x28,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_28.super_TestWithParam<prometheus::MetricType>.super_Test._vptr_Test !=
        (_func_int **)0x0) {
      (**(code **)(*local_28.super_TestWithParam<prometheus::MetricType>.super_Test._vptr_Test + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_P(CheckLabelNameTest, reject_le_for_histogram) {
  EXPECT_EQ(GetParam() != MetricType::Histogram, CheckLabelName("le"));
}